

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# str-util.cc
# Opt level: O3

string * tinyusdz::detail::extract_utf8_char
                   (string *__return_storage_ptr__,string *str,uint32_t start_i,int *len)

{
  byte bVar1;
  ulong uVar2;
  
  *len = 0;
  uVar2 = str->_M_string_length;
  if (uVar2 < start_i + 1) goto LAB_002a476a;
  bVar1 = (str->_M_dataplus)._M_p[start_i];
  if ((char)bVar1 < '\0') {
    if ((bVar1 & 0xe0) == 0xc0) {
      if (uVar2 < start_i + 2) goto LAB_002a476a;
      *len = 2;
    }
    else if ((bVar1 & 0xf0) == 0xe0) {
      if (uVar2 < start_i + 3) {
LAB_002a476a:
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        __return_storage_ptr__->_M_string_length = 0;
        (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
        return __return_storage_ptr__;
      }
      *len = 3;
    }
    else {
      if (((bVar1 & 0xf8) != 0xf0) || (uVar2 < start_i + 4)) goto LAB_002a476a;
      *len = 4;
    }
  }
  else {
    *len = 1;
  }
  ::std::__cxx11::string::substr((ulong)__return_storage_ptr__,(ulong)str);
  return __return_storage_ptr__;
}

Assistant:

inline std::string extract_utf8_char(const std::string &str, uint32_t start_i,
                                     int &len) {
  len = 0;

  if ((start_i + 1) > str.size()) {
    len = 0;
    return std::string();
  }

  unsigned char c = static_cast<unsigned char>(str[start_i]);

  if (c <= 127) {
    // ascii
    len = 1;
    return str.substr(start_i, 1);
  } else if ((c & 0xE0) == 0xC0) {
    if ((start_i + 2) > str.size()) {
      len = 0;
      return std::string();
    }
    len = 2;
    return str.substr(start_i, 2);
  } else if ((c & 0xF0) == 0xE0) {
    if ((start_i + 3) > str.size()) {
      len = 0;
      return std::string();
    }
    len = 3;
    return str.substr(start_i, 3);
  } else if ((c & 0xF8) == 0xF0) {
    if ((start_i + 4) > str.size()) {
      len = 0;
      return std::string();
    }
    len = 4;
    return str.substr(start_i, 4);
  } else {
    // invalid utf8
    len = 0;
    return std::string();
  }
}